

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

xmlElementPtr
xmlAddElementDecl(xmlValidCtxtPtr ctxt,xmlDtdPtr dtd,xmlChar *name,xmlElementTypeVal type,
                 xmlElementContentPtr content)

{
  int iVar1;
  xmlChar *pxVar2;
  xmlDictPtr pxVar3;
  xmlDictPtr local_68;
  xmlDictPtr dict;
  xmlChar *uqname;
  xmlChar *ns;
  xmlAttributePtr oldAttributes;
  xmlElementTablePtr table;
  xmlElementPtr ret;
  xmlElementContentPtr content_local;
  xmlChar *pxStack_28;
  xmlElementTypeVal type_local;
  xmlChar *name_local;
  xmlDtdPtr dtd_local;
  xmlValidCtxtPtr ctxt_local;
  
  ns = (xmlChar *)0x0;
  if (dtd == (xmlDtdPtr)0x0) {
    ctxt_local = (xmlValidCtxtPtr)0x0;
  }
  else if (name == (xmlChar *)0x0) {
    ctxt_local = (xmlValidCtxtPtr)0x0;
  }
  else {
    ret = (xmlElementPtr)content;
    content_local._4_4_ = type;
    pxStack_28 = name;
    name_local = (xmlChar *)dtd;
    dtd_local = (xmlDtdPtr)ctxt;
    if (type - XML_ELEMENT_TYPE_EMPTY < 3 || type == XML_ELEMENT_TYPE_ELEMENT) {
      switch((long)&switchD_001cf681::switchdataD_002754e4 +
             (long)(int)(&switchD_001cf681::switchdataD_002754e4)[type - XML_ELEMENT_TYPE_EMPTY]) {
      case 0x1cf683:
        if (content != (xmlElementContentPtr)0x0) {
          xmlErrValid(ctxt,XML_ERR_INTERNAL_ERROR,"xmlAddElementDecl: content != NULL for EMPTY\n",
                      (char *)0x0);
          return (xmlElementPtr)0x0;
        }
        break;
      case 0x1cf6b5:
        if (content != (xmlElementContentPtr)0x0) {
          xmlErrValid(ctxt,XML_ERR_INTERNAL_ERROR,"xmlAddElementDecl: content != NULL for ANY\n",
                      (char *)0x0);
          return (xmlElementPtr)0x0;
        }
        break;
      case 0x1cf6e7:
        if (content == (xmlElementContentPtr)0x0) {
          xmlErrValid(ctxt,XML_ERR_INTERNAL_ERROR,"xmlAddElementDecl: content == NULL for MIXED\n",
                      (char *)0x0);
          return (xmlElementPtr)0x0;
        }
        break;
      case 0x1cf716:
        if (content == (xmlElementContentPtr)0x0) {
          xmlErrValid(ctxt,XML_ERR_INTERNAL_ERROR,"xmlAddElementDecl: content == NULL for ELEMENT\n"
                      ,(char *)0x0);
          return (xmlElementPtr)0x0;
        }
      }
      pxVar2 = xmlSplitQName2(name,&uqname);
      if (pxVar2 != (xmlChar *)0x0) {
        pxStack_28 = pxVar2;
      }
      oldAttributes = *(xmlAttributePtr *)(name_local + 0x50);
      if (oldAttributes == (xmlAttributePtr)0x0) {
        local_68 = (xmlDictPtr)0x0;
        if (*(long *)(name_local + 0x40) != 0) {
          local_68 = *(xmlDictPtr *)(*(long *)(name_local + 0x40) + 0x98);
        }
        oldAttributes = (xmlAttributePtr)xmlHashCreateDict(0,local_68);
        *(xmlAttributePtr *)(name_local + 0x50) = oldAttributes;
      }
      if (oldAttributes == (xmlAttributePtr)0x0) {
        xmlVErrMemory((xmlValidCtxtPtr)dtd_local,"xmlAddElementDecl: Table creation failed!\n");
        if (pxVar2 != (xmlChar *)0x0) {
          (*xmlFree)(pxVar2);
        }
        if (uqname != (xmlChar *)0x0) {
          (*xmlFree)(uqname);
        }
        ctxt_local = (xmlValidCtxtPtr)0x0;
      }
      else {
        if ((((*(long *)(name_local + 0x40) != 0) &&
             (*(long *)(*(long *)(name_local + 0x40) + 0x50) != 0)) &&
            (table = (xmlElementTablePtr)
                     xmlHashLookup2(*(xmlHashTablePtr *)
                                     (*(long *)(*(long *)(name_local + 0x40) + 0x50) + 0x50),
                                    pxStack_28,uqname), table != (xmlElementTablePtr)0x0)) &&
           (table[2].size == 0)) {
          ns = *(xmlChar **)&table[2].random_seed;
          *(undefined8 *)&table[2].random_seed = 0;
          xmlHashRemoveEntry2(*(xmlHashTablePtr *)
                               (*(long *)(*(long *)(name_local + 0x40) + 0x50) + 0x50),pxStack_28,
                              uqname,(xmlHashDeallocator)0x0);
          xmlFreeElement((xmlElementPtr)table);
        }
        table = (xmlElementTablePtr)xmlHashLookup2((xmlHashTablePtr)oldAttributes,pxStack_28,uqname)
        ;
        if (table == (xmlElementTablePtr)0x0) {
          table = (xmlElementTablePtr)(*xmlMalloc)(0x70);
          if (table == (xmlElementTablePtr)0x0) {
            xmlVErrMemory((xmlValidCtxtPtr)dtd_local,"malloc failed");
            if (pxVar2 != (xmlChar *)0x0) {
              (*xmlFree)(pxVar2);
            }
            if (uqname != (xmlChar *)0x0) {
              (*xmlFree)(uqname);
            }
            return (xmlElementPtr)0x0;
          }
          memset(table,0,0x70);
          table->size = 0xf;
          pxVar3 = (xmlDictPtr)xmlStrdup(pxStack_28);
          table->dict = pxVar3;
          if (table->dict == (xmlDictPtr)0x0) {
            xmlVErrMemory((xmlValidCtxtPtr)dtd_local,"malloc failed");
            if (pxVar2 != (xmlChar *)0x0) {
              (*xmlFree)(pxVar2);
            }
            if (uqname != (xmlChar *)0x0) {
              (*xmlFree)(uqname);
            }
            (*xmlFree)(table);
            return (xmlElementPtr)0x0;
          }
          table[3].table = (_xmlHashEntry *)uqname;
          iVar1 = xmlHashAddEntry2((xmlHashTablePtr)oldAttributes,pxStack_28,uqname,table);
          if (iVar1 != 0) {
            xmlErrValidNode((xmlValidCtxtPtr)dtd_local,(xmlNodePtr)name_local,XML_DTD_ELEM_REDEFINED
                            ,"Redefinition of element %s\n",pxStack_28,(xmlChar *)0x0,(xmlChar *)0x0
                           );
            xmlFreeElement((xmlElementPtr)table);
            if (pxVar2 != (xmlChar *)0x0) {
              (*xmlFree)(pxVar2);
            }
            return (xmlElementPtr)0x0;
          }
          *(xmlChar **)&table[2].random_seed = ns;
        }
        else {
          if (table[2].size != 0) {
            xmlErrValidNode((xmlValidCtxtPtr)dtd_local,(xmlNodePtr)name_local,XML_DTD_ELEM_REDEFINED
                            ,"Redefinition of element %s\n",pxStack_28,(xmlChar *)0x0,(xmlChar *)0x0
                           );
            if (pxVar2 != (xmlChar *)0x0) {
              (*xmlFree)(pxVar2);
            }
            if (uqname != (xmlChar *)0x0) {
              (*xmlFree)(uqname);
            }
            return (xmlElementPtr)0x0;
          }
          if (uqname != (xmlChar *)0x0) {
            (*xmlFree)(uqname);
            uqname = (xmlChar *)0x0;
          }
        }
        table[2].size = content_local._4_4_;
        if ((dtd_local == (xmlDtdPtr)0x0) || (((ulong)dtd_local->next & 2) == 0)) {
          pxVar3 = (xmlDictPtr)
                   xmlCopyDocElementContent
                             (*(xmlDocPtr *)(name_local + 0x40),(xmlElementContentPtr)ret);
          table[2].dict = pxVar3;
        }
        else {
          table[2].dict = (xmlDictPtr)ret;
          if (ret != (xmlElementPtr)0x0) {
            ret->last = (_xmlNode *)0x1;
          }
        }
        *(xmlChar **)&table[1].size = name_local;
        table[2].table = *(_xmlHashEntry **)(name_local + 0x40);
        if (*(long *)(name_local + 0x20) == 0) {
          *(xmlElementTablePtr *)(name_local + 0x20) = table;
          *(xmlElementTablePtr *)(name_local + 0x18) = table;
        }
        else {
          *(xmlElementTablePtr *)(*(long *)(name_local + 0x20) + 0x30) = table;
          *(undefined8 *)&table[1].random_seed = *(undefined8 *)(name_local + 0x20);
          *(xmlElementTablePtr *)(name_local + 0x20) = table;
        }
        if (pxVar2 != (xmlChar *)0x0) {
          (*xmlFree)(pxVar2);
        }
        ctxt_local = (xmlValidCtxtPtr)table;
      }
    }
    else {
      xmlErrValid(ctxt,XML_ERR_INTERNAL_ERROR,"Internal: ELEMENT decl corrupted invalid type\n",
                  (char *)0x0);
      ctxt_local = (xmlValidCtxtPtr)0x0;
    }
  }
  return (xmlElementPtr)ctxt_local;
}

Assistant:

xmlElementPtr
xmlAddElementDecl(xmlValidCtxtPtr ctxt,
                  xmlDtdPtr dtd, const xmlChar *name,
                  xmlElementTypeVal type,
		  xmlElementContentPtr content) {
    xmlElementPtr ret;
    xmlElementTablePtr table;
    xmlAttributePtr oldAttributes = NULL;
    xmlChar *ns, *uqname;

    if (dtd == NULL) {
	return(NULL);
    }
    if (name == NULL) {
	return(NULL);
    }

    switch (type) {
        case XML_ELEMENT_TYPE_EMPTY:
	    if (content != NULL) {
		xmlErrValid(ctxt, XML_ERR_INTERNAL_ERROR,
		        "xmlAddElementDecl: content != NULL for EMPTY\n",
			NULL);
		return(NULL);
	    }
	    break;
	case XML_ELEMENT_TYPE_ANY:
	    if (content != NULL) {
		xmlErrValid(ctxt, XML_ERR_INTERNAL_ERROR,
		        "xmlAddElementDecl: content != NULL for ANY\n",
			NULL);
		return(NULL);
	    }
	    break;
	case XML_ELEMENT_TYPE_MIXED:
	    if (content == NULL) {
		xmlErrValid(ctxt, XML_ERR_INTERNAL_ERROR,
		        "xmlAddElementDecl: content == NULL for MIXED\n",
			NULL);
		return(NULL);
	    }
	    break;
	case XML_ELEMENT_TYPE_ELEMENT:
	    if (content == NULL) {
		xmlErrValid(ctxt, XML_ERR_INTERNAL_ERROR,
		        "xmlAddElementDecl: content == NULL for ELEMENT\n",
			NULL);
		return(NULL);
	    }
	    break;
	default:
	    xmlErrValid(ctxt, XML_ERR_INTERNAL_ERROR,
		    "Internal: ELEMENT decl corrupted invalid type\n",
		    NULL);
	    return(NULL);
    }

    /*
     * check if name is a QName
     */
    uqname = xmlSplitQName2(name, &ns);
    if (uqname != NULL)
	name = uqname;

    /*
     * Create the Element table if needed.
     */
    table = (xmlElementTablePtr) dtd->elements;
    if (table == NULL) {
	xmlDictPtr dict = NULL;

	if (dtd->doc != NULL)
	    dict = dtd->doc->dict;
        table = xmlHashCreateDict(0, dict);
	dtd->elements = (void *) table;
    }
    if (table == NULL) {
	xmlVErrMemory(ctxt,
            "xmlAddElementDecl: Table creation failed!\n");
	if (uqname != NULL)
	    xmlFree(uqname);
	if (ns != NULL)
	    xmlFree(ns);
        return(NULL);
    }

    /*
     * lookup old attributes inserted on an undefined element in the
     * internal subset.
     */
    if ((dtd->doc != NULL) && (dtd->doc->intSubset != NULL)) {
	ret = xmlHashLookup2(dtd->doc->intSubset->elements, name, ns);
	if ((ret != NULL) && (ret->etype == XML_ELEMENT_TYPE_UNDEFINED)) {
	    oldAttributes = ret->attributes;
	    ret->attributes = NULL;
	    xmlHashRemoveEntry2(dtd->doc->intSubset->elements, name, ns, NULL);
	    xmlFreeElement(ret);
	}
    }

    /*
     * The element may already be present if one of its attribute
     * was registered first
     */
    ret = xmlHashLookup2(table, name, ns);
    if (ret != NULL) {
	if (ret->etype != XML_ELEMENT_TYPE_UNDEFINED) {
#ifdef LIBXML_VALID_ENABLED
	    /*
	     * The element is already defined in this DTD.
	     */
	    xmlErrValidNode(ctxt, (xmlNodePtr) dtd, XML_DTD_ELEM_REDEFINED,
	                    "Redefinition of element %s\n",
			    name, NULL, NULL);
#endif /* LIBXML_VALID_ENABLED */
	    if (uqname != NULL)
		xmlFree(uqname);
            if (ns != NULL)
	        xmlFree(ns);
	    return(NULL);
	}
	if (ns != NULL) {
	    xmlFree(ns);
	    ns = NULL;
	}
    } else {
	ret = (xmlElementPtr) xmlMalloc(sizeof(xmlElement));
	if (ret == NULL) {
	    xmlVErrMemory(ctxt, "malloc failed");
	    if (uqname != NULL)
		xmlFree(uqname);
            if (ns != NULL)
	        xmlFree(ns);
	    return(NULL);
	}
	memset(ret, 0, sizeof(xmlElement));
	ret->type = XML_ELEMENT_DECL;

	/*
	 * fill the structure.
	 */
	ret->name = xmlStrdup(name);
	if (ret->name == NULL) {
	    xmlVErrMemory(ctxt, "malloc failed");
	    if (uqname != NULL)
		xmlFree(uqname);
            if (ns != NULL)
	        xmlFree(ns);
	    xmlFree(ret);
	    return(NULL);
	}
	ret->prefix = ns;

	/*
	 * Validity Check:
	 * Insertion must not fail
	 */
	if (xmlHashAddEntry2(table, name, ns, ret)) {
#ifdef LIBXML_VALID_ENABLED
	    /*
	     * The element is already defined in this DTD.
	     */
	    xmlErrValidNode(ctxt, (xmlNodePtr) dtd, XML_DTD_ELEM_REDEFINED,
	                    "Redefinition of element %s\n",
			    name, NULL, NULL);
#endif /* LIBXML_VALID_ENABLED */
	    xmlFreeElement(ret);
	    if (uqname != NULL)
		xmlFree(uqname);
	    return(NULL);
	}
	/*
	 * For new element, may have attributes from earlier
	 * definition in internal subset
	 */
	ret->attributes = oldAttributes;
    }

    /*
     * Finish to fill the structure.
     */
    ret->etype = type;
    /*
     * Avoid a stupid copy when called by the parser
     * and flag it by setting a special parent value
     * so the parser doesn't unallocate it.
     */
    if ((ctxt != NULL) && (ctxt->flags & XML_VCTXT_USE_PCTXT)) {
	ret->content = content;
	if (content != NULL)
	    content->parent = (xmlElementContentPtr) 1;
    } else {
	ret->content = xmlCopyDocElementContent(dtd->doc, content);
    }

    /*
     * Link it to the DTD
     */
    ret->parent = dtd;
    ret->doc = dtd->doc;
    if (dtd->last == NULL) {
	dtd->children = dtd->last = (xmlNodePtr) ret;
    } else {
        dtd->last->next = (xmlNodePtr) ret;
	ret->prev = dtd->last;
	dtd->last = (xmlNodePtr) ret;
    }
    if (uqname != NULL)
	xmlFree(uqname);
    return(ret);
}